

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  cmExecutionStatus status;
  LexicalPushPop lexScope;
  string currentFile;
  string currentParentFile;
  string local_c8;
  undefined1 local_a8 [32];
  _List_iterator<cmDefinitions> local_88;
  bool local_80;
  string local_78;
  StackIter local_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_PARENT_LIST_FILE","");
  pcVar3 = GetDefinition(this,&local_78);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  std::__cxx11::string::string((string *)local_50,pcVar3,(allocator *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE","");
  pcVar4 = GetDefinition(this,&local_c8);
  pcVar3 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  std::__cxx11::string::string((string *)&local_78,pcVar3,(allocator *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE","");
  AddDefinition(this,&local_c8,(filenametoread->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_a8,filenametoread);
  AddDefinition(this,&local_c8,(char *)local_a8._0_8_);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_PARENT_LIST_FILE","");
  local_a8._0_8_ = (this->Internal).x_;
  local_88._M_node =
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,(StackIter *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE","");
  local_a8._0_8_ = (this->Internal).x_;
  local_88._M_node =
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,(StackIter *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_DIR","");
  local_a8._0_8_ = (this->Internal).x_;
  local_88._M_node =
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,(StackIter *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_80 = true;
  local_88._M_node = (_List_node_base *)this;
  PushFunctionBlockerBarrier(this);
  lVar5 = (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 5) * -0x5555555555555555;
    lVar6 = lVar5 + -1 + (ulong)(lVar5 == 0);
    lVar5 = 0;
    while( true ) {
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
      ExecuteCommand(this,(cmListFileFunction *)
                          ((long)&(((listFile->Functions).
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_cmListFileContext).Name + lVar5),
                     (cmExecutionStatus *)&local_c8);
      if ((cmSystemTools::s_FatalErrorOccured != false) ||
         (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)) break;
      bVar2 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (((char)local_c8._M_dataplus._M_p != '\0') || (lVar5 = lVar5 + 0x60, bVar2))
      goto LAB_0025f329;
    }
    local_80 = false;
  }
LAB_0025f329:
  CheckForUnusedVariables(this);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,&local_c8,(char *)local_50[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE","");
  AddDefinition(this,&local_c8,local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath((string *)local_a8,&local_78);
  AddDefinition(this,&local_c8,(char *)local_a8._0_8_);
  if ((Internals *)local_a8._0_8_ != (Internals *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_PARENT_LIST_FILE","");
  local_a8._0_8_ = (this->Internal).x_;
  local_58.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_FILE","");
  local_a8._0_8_ = (this->Internal).x_;
  local_58.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CURRENT_LIST_DIR","");
  local_a8._0_8_ = (this->Internal).x_;
  local_58.current._M_node =
       (_List_iterator<cmDefinitions>)
       (((Internals *)local_a8._0_8_)->VarStack).
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
       super__List_node_base._M_next;
  cmDefinitions::Get(&local_c8,(StackIter *)local_a8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  PopFunctionBlockerBarrier((cmMakefile *)local_88._M_node,local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile
      = this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile
    = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                       cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Enforce balanced blocks (if/endif, function/endfunction, etc.).
  LexicalPushPop lexScope(this);

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for(size_t i =0; i < numberFunctions; ++i)
    {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i],status);
    if(cmSystemTools::GetFatalErrorOccured())
      {
      // Exit early due to error.
      lexScope.Quiet();
      break;
      }
    if(status.GetReturnInvoked())
      {
      // Exit early due to return command.
      break;
      }
    }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}